

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateFullElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  int iVar1;
  xmlRelaxNGValidStatePtr pxVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (elem != (xmlNodePtr)0x0)) &&
     (ctxt->pdef != (xmlRelaxNGDefinePtr_conflict)0x0)) {
    pxVar2 = xmlRelaxNGNewValidState(ctxt,elem->parent);
    if (pxVar2 != (xmlRelaxNGValidStatePtr)0x0) {
      pxVar2->seq = elem;
      ctxt->state = pxVar2;
      ctxt->errNo = 0;
      iVar1 = xmlRelaxNGValidateDefinition(ctxt,ctxt->pdef);
      uVar3 = 0xffffffff;
      if (iVar1 == 0) {
        uVar3 = -(uint)(ctxt->errNo != 0) | 1;
      }
      xmlRelaxNGFreeValidState(ctxt,ctxt->state);
      ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
    }
  }
  return uVar3;
}

Assistant:

int
xmlRelaxNGValidateFullElement(xmlRelaxNGValidCtxtPtr ctxt,
                              xmlDocPtr doc ATTRIBUTE_UNUSED,
                              xmlNodePtr elem)
{
    int ret;
    xmlRelaxNGValidStatePtr state;

    if ((ctxt == NULL) || (ctxt->pdef == NULL) || (elem == NULL))
        return (-1);
    state = xmlRelaxNGNewValidState(ctxt, elem->parent);
    if (state == NULL) {
        return (-1);
    }
    state->seq = elem;
    ctxt->state = state;
    ctxt->errNo = XML_RELAXNG_OK;
    ret = xmlRelaxNGValidateDefinition(ctxt, ctxt->pdef);
    if ((ret != 0) || (ctxt->errNo != XML_RELAXNG_OK))
        ret = -1;
    else
        ret = 1;
    xmlRelaxNGFreeValidState(ctxt, ctxt->state);
    ctxt->state = NULL;
    return (ret);
}